

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

void __thiscall ncnn::ParamDict::ParamDict(ParamDict *this)

{
  void *pvVar1;
  undefined8 *in_RDI;
  ParamDictPrivate *unaff_retaddr;
  ParamDict *in_stack_00000050;
  
  *in_RDI = &PTR__ParamDict_020134a8;
  pvVar1 = operator_new(0xe00);
  ParamDictPrivate::ParamDictPrivate(unaff_retaddr);
  in_RDI[1] = pvVar1;
  clear(in_stack_00000050);
  return;
}

Assistant:

ParamDict::ParamDict()
    : d(new ParamDictPrivate)
{
    clear();
}